

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

ALCenum alcGetEnumValue(ALCdevice *_device,ALCchar *enumname)

{
  ALCenum e;
  DeviceWrapper *local_30;
  ALCenum retval;
  DeviceWrapper *device;
  ALCchar *enumname_local;
  ALCdevice *_device_local;
  
  local_30 = (DeviceWrapper *)_device;
  if (_device == (ALCdevice *)0x0) {
    local_30 = &null_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcGetEnumValue);
  IO_PTR(_device);
  IO_STRING(enumname);
  e = (*REAL_alcGetEnumValue)(local_30->device,enumname);
  IO_ALCENUM(e);
  check_alc_error_events(local_30);
  check_al_async_states();
  APIUNLOCK();
  return e;
}

Assistant:

ALCenum alcGetEnumValue(ALCdevice *_device, const ALCchar *enumname)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    ALCenum retval;
    IO_START(alcGetEnumValue);
    IO_PTR(_device);
    IO_STRING(enumname);
    retval = REAL_alcGetEnumValue(device->device, enumname);
    IO_ALCENUM(retval);
    IO_END_ALC(device);
    return retval;
}